

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O2

void __thiscall
Diligent::Serializer<(Diligent::SerializerMode)0>::AlignOffset
          (Serializer<(Diligent::SerializerMode)0> *this,size_t Alignment)

{
  size_t val;
  type_conflict1 tVar1;
  TPointer puVar2;
  string msg;
  string local_38;
  
  val = GetSize(this);
  tVar1 = AlignUp<unsigned_long,unsigned_long>(val,Alignment);
  puVar2 = this->m_Ptr;
  if ((char (*) [28])this->m_End < (char (*) [28])(puVar2 + (tVar1 - val))) {
    FormatString<char[26],char[28]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Ptr + AlignShift <= m_End",(char (*) [28])(puVar2 + (tVar1 - val)))
    ;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"AlignOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x12f);
    std::__cxx11::string::~string((string *)&local_38);
    puVar2 = this->m_Ptr;
  }
  this->m_Ptr = puVar2 + (tVar1 - val);
  return;
}

Assistant:

void AlignOffset(size_t Alignment)
    {
        const auto Size       = GetSize();
        const auto AlignShift = AlignUp(Size, Alignment) - Size;
        VERIFY_EXPR(m_Ptr + AlignShift <= m_End);
        m_Ptr += AlignShift;
    }